

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O2

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineDynamicStateCreateInfo *state)

{
  void *pvVar1;
  deUint32 dVar2;
  undefined4 uVar3;
  allocator_type local_31;
  vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>> local_30 [24];
  
  std::vector<vk::VkDynamicState,std::allocator<vk::VkDynamicState>>::
  vector<vk::VkDynamicState_const*,void>
            (local_30,state->pDynamicStates,state->pDynamicStates + state->dynamicStateCount,
             &local_31);
  std::vector<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::_M_move_assign
            (&this->m_dynamicStates,local_30);
  std::_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>::~_Vector_base
            ((_Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_> *)local_30);
  dVar2 = state->dynamicStateCount;
  (this->m_dynamicState).flags = state->flags;
  (this->m_dynamicState).dynamicStateCount = dVar2;
  uVar3 = *(undefined4 *)&state->field_0x4;
  pvVar1 = state->pNext;
  (this->m_dynamicState).sType = state->sType;
  *(undefined4 *)&(this->m_dynamicState).field_0x4 = uVar3;
  (this->m_dynamicState).pNext = pvVar1;
  (this->m_dynamicState).pDynamicStates =
       (this->m_dynamicStates).
       super__Vector_base<vk::VkDynamicState,_std::allocator<vk::VkDynamicState>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->super_VkGraphicsPipelineCreateInfo).pDynamicState = &this->m_dynamicState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineDynamicStateCreateInfo& state)
{
	m_dynamicStates					= std::vector<vk::VkDynamicState>(state.pDynamicStates, state.pDynamicStates + state.dynamicStateCount);
	m_dynamicState					= state;
	m_dynamicState.pDynamicStates	= &m_dynamicStates[0];
	pDynamicState					= &m_dynamicState;

	return *this;
}